

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

void __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::Insert
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  bool bVar1;
  uint height;
  Node *pNVar2;
  Node *x;
  long lVar3;
  ulong uVar4;
  int n;
  ulong uVar5;
  long in_FS_OFFSET;
  Node *prev [12];
  Node *local_88 [13];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = FindGreaterOrEqual(this,key,local_88);
  if (pNVar2 != (Node *)0x0) {
    bVar1 = Equal(this,key,&pNVar2->key);
    if (bVar1) {
      __assert_fail("x == nullptr || !Equal(key, x->key)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/skiplist.h"
                    ,0x158,
                    "void leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Insert(const Key &) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
  }
  height = RandomHeight(this);
  if ((this->max_height_).super___atomic_base<int>._M_i < (int)height) {
    pNVar2 = this->head_;
    for (lVar3 = (long)(this->max_height_).super___atomic_base<int>._M_i; lVar3 < (int)height;
        lVar3 = lVar3 + 1) {
      local_88[lVar3] = pNVar2;
    }
    (this->max_height_).super___atomic_base<int>._M_i = height;
  }
  pNVar2 = NewNode(this,key,height);
  uVar5 = 0;
  uVar4 = (ulong)height;
  if ((int)height < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    n = (int)uVar5;
    x = Node::NoBarrier_Next(local_88[uVar5],n);
    Node::NoBarrier_SetNext(pNVar2,n,x);
    Node::SetNext(local_88[uVar5],n,pNVar2);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SkipList<Key, Comparator>::Insert(const Key& key) {
  // TODO(opt): We can use a barrier-free variant of FindGreaterOrEqual()
  // here since Insert() is externally synchronized.
  Node* prev[kMaxHeight];
  Node* x = FindGreaterOrEqual(key, prev);

  // Our data structure does not allow duplicate insertion
  assert(x == nullptr || !Equal(key, x->key));

  int height = RandomHeight();
  if (height > GetMaxHeight()) {
    for (int i = GetMaxHeight(); i < height; i++) {
      prev[i] = head_;
    }
    // It is ok to mutate max_height_ without any synchronization
    // with concurrent readers.  A concurrent reader that observes
    // the new value of max_height_ will see either the old value of
    // new level pointers from head_ (nullptr), or a new value set in
    // the loop below.  In the former case the reader will
    // immediately drop to the next level since nullptr sorts after all
    // keys.  In the latter case the reader will use the new node.
    max_height_.store(height, std::memory_order_relaxed);
  }

  x = NewNode(key, height);
  for (int i = 0; i < height; i++) {
    // NoBarrier_SetNext() suffices since we will add a barrier when
    // we publish a pointer to "x" in prev[i].
    x->NoBarrier_SetNext(i, prev[i]->NoBarrier_Next(i));
    prev[i]->SetNext(i, x);
  }
}